

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

void __thiscall
QRhiGles2::bindShaderResources
          (QRhiGles2 *this,QGles2CommandBuffer *cbD,QRhiGraphicsPipeline *maybeGraphicsPs,
          QRhiComputePipeline *maybeComputePs,QRhiShaderResourceBindings *srb,uint *dynOfsPairs,
          int dynOfsCount)

{
  float fVar1;
  int iVar2;
  QRhiBuffer *pQVar3;
  bool bVar4;
  size_type sVar5;
  QRhiShaderResourceBinding *binding;
  Data *pDVar6;
  char *pcVar7;
  const_iterator pQVar8;
  float *src_00;
  int *piVar9;
  data32_t *pdVar10;
  QGles2Texture *texD_00;
  const_iterator pQVar11;
  const_iterator pSVar12;
  const_iterator pSVar13;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_FS_OFFSET;
  int in_stack_00000008;
  int loc_1;
  SeparateTexture *sepTex;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  add_const_t<QVarLengthArray<QRhiGles2::Scratch::SeparateTexture,_8LL>_> *__range4_1;
  SeparateSampler *sepSampler;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  add_const_t<QVarLengthArray<QRhiGles2::Scratch::SeparateSampler,_4LL>_> *__range3_1;
  QGles2SamplerDescription *shaderSampler_1;
  const_iterator __end2;
  const_iterator __begin2;
  QGles2SamplerDescriptionVector *__range2;
  uint psGeneration_1;
  void *ps_1;
  QGles2SamplerDescriptionVector *samplers_1;
  QGles2Buffer *bufD_1;
  GLenum access;
  bool layered;
  QGles2Texture *texD_2;
  QGles2Sampler *samplerD_1;
  QGles2Texture *texD_1;
  int elem_1;
  int loc;
  QGles2SamplerDescription *shaderSampler;
  const_iterator __end4;
  const_iterator __begin4;
  QGles2SamplerDescriptionVector *__range4;
  QGles2Sampler *samplerD;
  QGles2Texture *texD;
  int elem;
  uint psGeneration;
  void *ps;
  QGles2SamplerDescriptionVector *samplers;
  int elemCount_7;
  int elemCount_6;
  int elemCount_5;
  float *srcMat;
  int elemCount_4;
  QGles2UniformState *thisUniformState_3;
  float *v_3;
  int elemCount_3;
  QGles2UniformState *thisUniformState_2;
  float *v_2;
  int elemCount_2;
  QGles2UniformState *thisUniformState_1;
  float *v_1;
  int elemCount_1;
  QGles2UniformState *thisUniformState;
  float v;
  int elemCount;
  void *src;
  QGles2UniformDescription *uniform;
  const_iterator __end3;
  const_iterator __begin3;
  add_const_t<QVarLengthArray<QGles2UniformDescription,_8LL>_> *__range3;
  char *bufView;
  QGles2Buffer *bufD;
  int j;
  int viewOffset;
  Data *b;
  int ie;
  int i;
  QGles2UniformState *uniformState;
  QGles2UniformDescriptionVector *uniforms;
  QGles2ShaderResourceBindings *srbD;
  bool activeTexUnitAltered;
  int texUnit;
  float mat [9];
  GLfloat in_stack_fffffffffffffc68;
  Flag in_stack_fffffffffffffc6c;
  QVarLengthArray<QRhiShaderResourceBinding,_12LL> *in_stack_fffffffffffffc70;
  GLsizei count;
  QGles2Sampler *in_stack_fffffffffffffc78;
  GLint location;
  QGles2Texture *in_stack_fffffffffffffc80;
  GLuint in_stack_fffffffffffffc88;
  quint32 in_stack_fffffffffffffc8c;
  QRhiGles2 *in_stack_fffffffffffffc90;
  ulong in_stack_fffffffffffffca0;
  GLenum in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcac;
  bool *in_stack_fffffffffffffcb0;
  long local_2a8;
  const_iterator local_278;
  const_iterator local_258;
  const_iterator local_238;
  GLfloat local_208;
  int local_1e8;
  const_iterator local_1d0;
  int local_1b0;
  const_iterator local_108;
  int local_e8;
  int local_e4;
  int local_d4;
  char local_68 [32];
  int local_48 [2];
  undefined1 local_3d [5];
  undefined8 local_38;
  float local_30;
  undefined8 local_2c;
  float local_24;
  undefined8 local_20;
  float local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_3d._1_4_ = 1;
  local_3d[0] = 0;
  if (in_RDX == 0) {
    local_2a8 = in_RCX + 400;
  }
  else {
    local_2a8 = in_RDX + 0x498;
  }
  QVLABase<QRhiGles2::Scratch::SeparateTexture>::clear
            ((QVLABase<QRhiGles2::Scratch::SeparateTexture> *)(in_RDI + 0xa90));
  QVLABase<QRhiGles2::Scratch::SeparateSampler>::clear
            ((QVLABase<QRhiGles2::Scratch::SeparateSampler> *)(in_RDI + 0xb28));
  local_d4 = 0;
  sVar5 = QVLABaseBase::size((QVLABaseBase *)(in_R8 + 0x30));
  local_208 = in_stack_fffffffffffffc68;
  do {
    if (local_d4 == (int)sVar5) {
      bVar4 = QVarLengthArray<QRhiGles2::Scratch::SeparateTexture,_8LL>::isEmpty
                        ((QVarLengthArray<QRhiGles2::Scratch::SeparateTexture,_8LL> *)0x926999);
      if ((!bVar4) ||
         (bVar4 = QVarLengthArray<QRhiGles2::Scratch::SeparateSampler,_4LL>::isEmpty
                            ((QVarLengthArray<QRhiGles2::Scratch::SeparateSampler,_4LL> *)0x9269ba),
         !bVar4)) {
        if (in_RDX == 0) {
          texD_00 = (QGles2Texture *)(in_RCX + 0x138);
        }
        else {
          texD_00 = (QGles2Texture *)(in_RDX + 0x440);
        }
        local_238 = QVLABase<QGles2SamplerDescription>::begin
                              ((QVLABase<QGles2SamplerDescription> *)0x926ab7);
        pQVar11 = QVLABase<QGles2SamplerDescription>::end
                            ((QVLABase<QGles2SamplerDescription> *)in_stack_fffffffffffffc70);
        for (; local_238 != pQVar11; local_238 = local_238 + 1) {
          if (local_238->combinedBinding < 0) {
            local_258 = QVLABase<QRhiGles2::Scratch::SeparateSampler>::begin
                                  ((QVLABase<QRhiGles2::Scratch::SeparateSampler> *)0x926b5a);
            pSVar12 = QVLABase<QRhiGles2::Scratch::SeparateSampler>::end
                                ((QVLABase<QRhiGles2::Scratch::SeparateSampler> *)
                                 in_stack_fffffffffffffc70);
            for (; local_258 != pSVar12; local_258 = local_258 + 1) {
              if (local_258->binding == local_238->sbinding) {
                local_278 = QVLABase<QRhiGles2::Scratch::SeparateTexture>::begin
                                      ((QVLABase<QRhiGles2::Scratch::SeparateTexture> *)0x926c07);
                pSVar13 = QVLABase<QRhiGles2::Scratch::SeparateTexture>::end
                                    ((QVLABase<QRhiGles2::Scratch::SeparateTexture> *)
                                     in_stack_fffffffffffffc70);
                for (; local_278 != pSVar13; local_278 = local_278 + 1) {
                  if (local_278->binding == local_238->tbinding) {
                    in_stack_fffffffffffffc70 =
                         (QVarLengthArray<QRhiShaderResourceBinding,_12LL> *)(local_3d + 1);
                    bindCombinedSampler(in_stack_fffffffffffffc90,
                                        (QGles2CommandBuffer *)
                                        CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88
                                                ),texD_00,(QGles2Sampler *)local_3d,
                                        in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                                        (int)in_stack_fffffffffffffca0,
                                        (int *)CONCAT44(in_stack_fffffffffffffcac,
                                                        in_stack_fffffffffffffca8),
                                        in_stack_fffffffffffffcb0);
                  }
                }
              }
            }
          }
        }
      }
      if ((local_3d[0] & 1) != 0) {
        QOpenGLFunctions::glActiveTexture
                  ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    binding = QVarLengthArray<QRhiShaderResourceBinding,_12LL>::at
                        (in_stack_fffffffffffffc70,CONCAT44(in_stack_fffffffffffffc6c,local_208));
    pDVar6 = QRhiImplementation::shaderResourceBindingData(binding);
    switch(pDVar6->type) {
    case UniformBuffer:
      local_e4 = (pDVar6->u).simage.level;
      for (local_e8 = 0; local_e8 < in_stack_00000008; local_e8 = local_e8 + 1) {
        if (*(int *)(in_R9 + (long)(local_e8 << 1) * 4) == pDVar6->binding) {
          local_e4 = *(int *)(in_R9 + (long)(local_e8 * 2 + 1) * 4);
          break;
        }
      }
      pcVar7 = QByteArray::constData((QByteArray *)0x925301);
      local_108 = QVLABase<QGles2UniformDescription>::begin
                            ((QVLABase<QGles2UniformDescription> *)0x925343);
      pQVar8 = QVLABase<QGles2UniformDescription>::end
                         ((QVLABase<QGles2UniformDescription> *)in_stack_fffffffffffffc70);
      for (; local_108 != pQVar8; local_108 = local_108 + 1) {
        if (local_108->binding == pDVar6->binding) {
          src_00 = (float *)(pcVar7 + (ulong)local_108->offset + (long)local_e4);
          count = (GLsizei)in_stack_fffffffffffffc78;
          location = (GLint)((ulong)in_stack_fffffffffffffc78 >> 0x20);
          switch(local_108->type) {
          case Float:
            iVar2 = local_108->arrayDim;
            if (iVar2 < 1) {
              fVar1 = *src_00;
              if (local_108->glslLocation < 0x400) {
                piVar9 = (int *)(local_2a8 + (long)local_108->glslLocation * 0x14);
                if (((*piVar9 != 1) || ((float)piVar9[1] != fVar1)) ||
                   (NAN((float)piVar9[1]) || NAN(fVar1))) {
                  *piVar9 = 1;
                  piVar9[1] = (int)fVar1;
                  QOpenGLFunctions::glUniform1f
                            ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c
                             ,local_208);
                }
              }
              else {
                QOpenGLFunctions::glUniform1f
                          ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                           local_208);
              }
            }
            else {
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::resize
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)
                         in_stack_fffffffffffffc70,CONCAT44(in_stack_fffffffffffffc6c,local_208));
              pdVar10 = QVLABase<QRhiGles2::Scratch::data32_t>::data
                                  ((QVLABase<QRhiGles2::Scratch::data32_t> *)(in_RDI + 0x878));
              qrhi_std140_to_packed<float>(&pdVar10->f,1,iVar2,src_00);
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::constData
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)0x9255ba);
              QOpenGLFunctions::glUniform1fv
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         (GLsizei)local_208,(GLfloat *)0x9255d8);
            }
            break;
          case Vec2:
            iVar2 = local_108->arrayDim;
            if (iVar2 < 1) {
              if (local_108->glslLocation < 0x400) {
                piVar9 = (int *)(local_2a8 + (long)local_108->glslLocation * 0x14);
                if (((*piVar9 != 2) || ((float)piVar9[1] != *src_00)) ||
                   ((NAN((float)piVar9[1]) || NAN(*src_00) ||
                    (((float)piVar9[2] != src_00[1] || (NAN((float)piVar9[2]) || NAN(src_00[1]))))))
                   ) {
                  *piVar9 = 2;
                  piVar9[1] = (int)*src_00;
                  piVar9[2] = (int)src_00[1];
                  QOpenGLFunctions::glUniform2fv
                            ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c
                             ,(GLsizei)local_208,(GLfloat *)0x92570c);
                }
              }
              else {
                QOpenGLFunctions::glUniform2fv
                          ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                           (GLsizei)local_208,(GLfloat *)0x92573a);
              }
            }
            else {
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::resize
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)
                         in_stack_fffffffffffffc70,CONCAT44(in_stack_fffffffffffffc6c,local_208));
              pdVar10 = QVLABase<QRhiGles2::Scratch::data32_t>::data
                                  ((QVLABase<QRhiGles2::Scratch::data32_t> *)(in_RDI + 0x878));
              qrhi_std140_to_packed<float>(&pdVar10->f,2,iVar2,src_00);
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::constData
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)0x9257d2);
              QOpenGLFunctions::glUniform2fv
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         (GLsizei)local_208,(GLfloat *)0x9257f0);
            }
            break;
          case Vec3:
            iVar2 = local_108->arrayDim;
            if (iVar2 < 1) {
              if (local_108->glslLocation < 0x400) {
                piVar9 = (int *)(local_2a8 + (long)local_108->glslLocation * 0x14);
                if (((((*piVar9 != 3) || ((float)piVar9[1] != *src_00)) ||
                     (NAN((float)piVar9[1]) || NAN(*src_00))) ||
                    (((float)piVar9[2] != src_00[1] || (NAN((float)piVar9[2]) || NAN(src_00[1])))))
                   || (((float)piVar9[3] != src_00[2] || (NAN((float)piVar9[3]) || NAN(src_00[2]))))
                   ) {
                  *piVar9 = 3;
                  piVar9[1] = (int)*src_00;
                  piVar9[2] = (int)src_00[1];
                  piVar9[3] = (int)src_00[2];
                  QOpenGLFunctions::glUniform3fv
                            ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c
                             ,(GLsizei)local_208,(GLfloat *)0x92595e);
                }
              }
              else {
                QOpenGLFunctions::glUniform3fv
                          ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                           (GLsizei)local_208,(GLfloat *)0x92598c);
              }
            }
            else {
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::resize
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)
                         in_stack_fffffffffffffc70,CONCAT44(in_stack_fffffffffffffc6c,local_208));
              pdVar10 = QVLABase<QRhiGles2::Scratch::data32_t>::data
                                  ((QVLABase<QRhiGles2::Scratch::data32_t> *)(in_RDI + 0x878));
              qrhi_std140_to_packed<float>(&pdVar10->f,3,iVar2,src_00);
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::constData
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)0x925a23);
              QOpenGLFunctions::glUniform3fv
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         (GLsizei)local_208,(GLfloat *)0x925a41);
            }
            break;
          case Vec4:
            if (local_108->arrayDim < 1) {
              if (local_108->glslLocation < 0x400) {
                piVar9 = (int *)(local_2a8 + (long)local_108->glslLocation * 0x14);
                if ((((*piVar9 != 4) || ((float)piVar9[1] != *src_00)) ||
                    (NAN((float)piVar9[1]) || NAN(*src_00))) ||
                   (((((float)piVar9[2] != src_00[1] || (NAN((float)piVar9[2]) || NAN(src_00[1])))
                     || (((float)piVar9[3] != src_00[2] ||
                         ((NAN((float)piVar9[3]) || NAN(src_00[2]) ||
                          ((float)piVar9[4] != src_00[3])))))) ||
                    (NAN((float)piVar9[4]) || NAN(src_00[3]))))) {
                  *piVar9 = 4;
                  piVar9[1] = (int)*src_00;
                  piVar9[2] = (int)src_00[1];
                  piVar9[3] = (int)src_00[2];
                  piVar9[4] = (int)src_00[3];
                  QOpenGLFunctions::glUniform4fv
                            ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c
                             ,(GLsizei)local_208,(GLfloat *)0x925be6);
                }
              }
              else {
                QOpenGLFunctions::glUniform4fv
                          ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                           (GLsizei)local_208,(GLfloat *)0x925c14);
              }
            }
            else {
              QOpenGLFunctions::glUniform4fv
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         (GLsizei)local_208,(GLfloat *)0x925c44);
            }
            break;
          case Mat2:
            QOpenGLFunctions::glUniformMatrix2fv
                      ((QOpenGLFunctions *)in_stack_fffffffffffffc80,location,count,
                       (GLboolean)((ulong)in_stack_fffffffffffffc70 >> 0x38),
                       (GLfloat *)CONCAT44(in_stack_fffffffffffffc6c,local_208));
            break;
          default:
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78
                       ,(int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffc6c,local_208));
            QMessageLogger::warning
                      (local_68,
                       "Uniform with buffer binding %d, buffer offset %d has unsupported type %d",
                       (ulong)(uint)local_108->binding,(ulong)local_108->offset,
                       (ulong)local_108->type);
            break;
          case Mat3:
            iVar2 = local_108->arrayDim;
            if (iVar2 < 1) {
              memset(&local_38,0xff,0x24);
              local_38 = *(undefined8 *)src_00;
              local_30 = src_00[2];
              local_2c = *(undefined8 *)(src_00 + 4);
              local_24 = src_00[6];
              local_20 = *(undefined8 *)(src_00 + 8);
              local_18 = src_00[10];
              QOpenGLFunctions::glUniformMatrix3fv
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc80,
                         (GLint)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                         (GLsizei)in_stack_fffffffffffffc78,
                         (GLboolean)((ulong)in_stack_fffffffffffffc70 >> 0x38),
                         (GLfloat *)CONCAT44(in_stack_fffffffffffffc6c,local_208));
            }
            else {
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::resize
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)
                         in_stack_fffffffffffffc70,CONCAT44(in_stack_fffffffffffffc6c,local_208));
              pdVar10 = QVLABase<QRhiGles2::Scratch::data32_t>::data
                                  ((QVLABase<QRhiGles2::Scratch::data32_t> *)(in_RDI + 0x878));
              qrhi_std140_to_packed<float>(&pdVar10->f,3,iVar2 * 3,src_00);
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::constData
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)0x925de2);
              QOpenGLFunctions::glUniformMatrix3fv
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc80,
                         (GLint)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                         (GLsizei)in_stack_fffffffffffffc78,
                         (GLboolean)((ulong)in_stack_fffffffffffffc70 >> 0x38),
                         (GLfloat *)CONCAT44(in_stack_fffffffffffffc6c,local_208));
            }
            break;
          case Mat4:
            local_48[1] = 1;
            qMax<int>(local_48 + 1,&local_108->arrayDim);
            QOpenGLFunctions::glUniformMatrix4fv
                      ((QOpenGLFunctions *)in_stack_fffffffffffffc80,
                       (GLint)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                       (GLsizei)in_stack_fffffffffffffc78,
                       (GLboolean)((ulong)in_stack_fffffffffffffc70 >> 0x38),
                       (GLfloat *)CONCAT44(in_stack_fffffffffffffc6c,local_208));
            break;
          case Int:
            iVar2 = local_108->arrayDim;
            if (iVar2 < 1) {
              QOpenGLFunctions::glUniform1i
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         (GLint)local_208);
            }
            else {
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::resize
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)
                         in_stack_fffffffffffffc70,CONCAT44(in_stack_fffffffffffffc6c,local_208));
              pdVar10 = QVLABase<QRhiGles2::Scratch::data32_t>::data
                                  ((QVLABase<QRhiGles2::Scratch::data32_t> *)(in_RDI + 0x878));
              qrhi_std140_to_packed<int>(&pdVar10->i,1,iVar2,src_00);
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::constData
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)0x925f52);
              QOpenGLFunctions::glUniform1iv
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         (GLsizei)local_208,(GLint *)0x925f70);
            }
            break;
          case Int2:
            iVar2 = local_108->arrayDim;
            if (iVar2 < 1) {
              QOpenGLFunctions::glUniform2iv
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         (GLsizei)local_208,(GLint *)0x925fbd);
            }
            else {
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::resize
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)
                         in_stack_fffffffffffffc70,CONCAT44(in_stack_fffffffffffffc6c,local_208));
              pdVar10 = QVLABase<QRhiGles2::Scratch::data32_t>::data
                                  ((QVLABase<QRhiGles2::Scratch::data32_t> *)(in_RDI + 0x878));
              qrhi_std140_to_packed<int>(&pdVar10->i,2,iVar2,src_00);
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::constData
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)0x92604c);
              QOpenGLFunctions::glUniform2iv
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         (GLsizei)local_208,(GLint *)0x926061);
            }
            break;
          case Int3:
            iVar2 = local_108->arrayDim;
            if (iVar2 < 1) {
              QOpenGLFunctions::glUniform3iv
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         (GLsizei)local_208,(GLint *)0x9260ae);
            }
            else {
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::resize
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)
                         in_stack_fffffffffffffc70,CONCAT44(in_stack_fffffffffffffc6c,local_208));
              pdVar10 = QVLABase<QRhiGles2::Scratch::data32_t>::data
                                  ((QVLABase<QRhiGles2::Scratch::data32_t> *)(in_RDI + 0x878));
              qrhi_std140_to_packed<int>(&pdVar10->i,3,iVar2,src_00);
              QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL>::constData
                        ((QVarLengthArray<QRhiGles2::Scratch::data32_t,_128LL> *)0x92613c);
              QOpenGLFunctions::glUniform3iv
                        ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                         (GLsizei)local_208,(GLint *)0x926151);
            }
            break;
          case Int4:
            local_48[0] = 1;
            qMax<int>(local_48,&local_108->arrayDim);
            QOpenGLFunctions::glUniform4iv
                      ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                       (GLsizei)local_208,(GLint *)0x9261b5);
            break;
          case Uint:
            QOpenGLExtraFunctions::glUniform1ui
                      ((QOpenGLExtraFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                       (GLuint)local_208);
            break;
          case Uint2:
            QOpenGLExtraFunctions::glUniform2uiv
                      ((QOpenGLExtraFunctions *)in_stack_fffffffffffffc80,location,count,
                       (GLuint *)in_stack_fffffffffffffc70);
            break;
          case Uint3:
            QOpenGLExtraFunctions::glUniform3uiv
                      ((QOpenGLExtraFunctions *)in_stack_fffffffffffffc80,location,count,
                       (GLuint *)in_stack_fffffffffffffc70);
            break;
          case Uint4:
            QOpenGLExtraFunctions::glUniform4uiv
                      ((QOpenGLExtraFunctions *)in_stack_fffffffffffffc80,location,count,
                       (GLuint *)in_stack_fffffffffffffc70);
            break;
          case Bool:
            QOpenGLFunctions::glUniform1i
                      ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                       (GLint)local_208);
            break;
          case Bool2:
            QOpenGLFunctions::glUniform2iv
                      ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                       (GLsizei)local_208,(GLint *)0x9262d5);
            break;
          case Bool3:
            QOpenGLFunctions::glUniform3iv
                      ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                       (GLsizei)local_208,(GLint *)0x926306);
            break;
          case Bool4:
            QOpenGLFunctions::glUniform4iv
                      ((QOpenGLFunctions *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                       (GLsizei)local_208,(GLint *)0x926334);
          }
        }
      }
      break;
    case SampledTexture:
      if (in_RDX == 0) {
        in_stack_fffffffffffffcb0 = (bool *)(in_RCX + 0x138);
      }
      else {
        in_stack_fffffffffffffcb0 = (bool *)(in_RDX + 0x440);
      }
      for (local_1b0 = 0; local_1b0 < (pDVar6->u).stex.count; local_1b0 = local_1b0 + 1) {
        local_1d0 = QVLABase<QGles2SamplerDescription>::begin
                              ((QVLABase<QGles2SamplerDescription> *)0x926512);
        pQVar11 = QVLABase<QGles2SamplerDescription>::end
                            ((QVLABase<QGles2SamplerDescription> *)in_stack_fffffffffffffc70);
        for (; local_1d0 != pQVar11; local_1d0 = local_1d0 + 1) {
          if (local_1d0->combinedBinding == pDVar6->binding) {
            local_208 = (GLfloat)(local_1d0->glslLocation + local_1b0);
            in_stack_fffffffffffffc70 =
                 (QVarLengthArray<QRhiShaderResourceBinding,_12LL> *)(local_3d + 1);
            in_stack_fffffffffffffc78 = (QGles2Sampler *)local_3d;
            bindCombinedSampler(in_stack_fffffffffffffc90,
                                (QGles2CommandBuffer *)
                                CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                                in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                                in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,
                                (int)in_stack_fffffffffffffca0,
                                (int *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8)
                                ,in_stack_fffffffffffffcb0);
            break;
          }
        }
      }
      break;
    case Texture:
      for (local_1e8 = 0; local_1e8 < (pDVar6->u).stex.count; local_1e8 = local_1e8 + 1) {
        QVarLengthArray<QRhiGles2::Scratch::SeparateTexture,_8LL>::append
                  ((QVarLengthArray<QRhiGles2::Scratch::SeparateTexture,_8LL> *)
                   in_stack_fffffffffffffc70,
                   (SeparateTexture *)CONCAT44(in_stack_fffffffffffffc6c,local_208));
      }
      break;
    case Sampler:
      QVarLengthArray<QRhiGles2::Scratch::SeparateSampler,_4LL>::append
                ((QVarLengthArray<QRhiGles2::Scratch::SeparateSampler,_4LL> *)
                 in_stack_fffffffffffffc70,
                 (SeparateSampler *)CONCAT44(in_stack_fffffffffffffc6c,local_208));
      break;
    case ImageLoad:
    case ImageStore:
    case ImageLoadStore:
      pQVar3 = (pDVar6->u).ubuf.buf;
      bVar4 = QFlags<QRhiTexture::Flag>::testFlag
                        ((QFlags<QRhiTexture::Flag> *)in_stack_fffffffffffffc70,
                         in_stack_fffffffffffffc6c);
      in_stack_fffffffffffffcac = CONCAT13(1,(int3)in_stack_fffffffffffffcac);
      if (!bVar4) {
        bVar4 = QFlags<QRhiTexture::Flag>::testFlag
                          ((QFlags<QRhiTexture::Flag> *)in_stack_fffffffffffffc70,
                           in_stack_fffffffffffffc6c);
        in_stack_fffffffffffffcac = CONCAT13(1,(int3)in_stack_fffffffffffffcac);
        if (!bVar4) {
          bVar4 = QFlags<QRhiTexture::Flag>::testFlag
                            ((QFlags<QRhiTexture::Flag> *)in_stack_fffffffffffffc70,
                             in_stack_fffffffffffffc6c);
          in_stack_fffffffffffffcac = CONCAT13(bVar4,(int3)in_stack_fffffffffffffcac);
        }
      }
      local_208 = 4.90482e-41;
      if (pDVar6->type == ImageLoad) {
        local_208 = 4.90454e-41;
      }
      else if (pDVar6->type == ImageStore) {
        local_208 = 4.90468e-41;
      }
      in_stack_fffffffffffffc70 =
           (QVarLengthArray<QRhiShaderResourceBinding,_12LL> *)
           CONCAT44((int)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                    pQVar3[1].m_usage.super_QFlagsStorageHelper<QRhiBuffer::UsageFlag,_4>.
                    super_QFlagsStorage<QRhiBuffer::UsageFlag>.i);
      QOpenGLExtraFunctions::glBindImageTexture
                ((QOpenGLExtraFunctions *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                 in_stack_fffffffffffffc88,(GLint)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                 (GLboolean)((ulong)in_stack_fffffffffffffc80 >> 0x18),
                 (GLint)((ulong)in_stack_fffffffffffffc78 >> 0x20),(GLenum)in_stack_fffffffffffffca0
                 ,in_stack_fffffffffffffca8);
      break;
    case BufferLoad:
    case BufferStore:
    case BufferLoadStore:
      if (((pDVar6->u).ubuf.offset == 0) && ((pDVar6->u).ubuf.maybeSize == 0)) {
        QOpenGLExtraFunctions::glBindBufferBase
                  ((QOpenGLExtraFunctions *)in_stack_fffffffffffffc80,
                   (GLenum)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                   (GLuint)in_stack_fffffffffffffc78,
                   (GLuint)((ulong)in_stack_fffffffffffffc70 >> 0x20));
      }
      else {
        in_stack_fffffffffffffc90 = *(QRhiGles2 **)(in_RDI + 400);
        in_stack_fffffffffffffca0 = (ulong)(pDVar6->u).ubuf.offset;
        if ((pDVar6->u).ubuf.maybeSize == 0) {
          in_stack_fffffffffffffc8c = ((pDVar6->u).ubuf.buf)->m_size;
        }
        else {
          in_stack_fffffffffffffc8c = (pDVar6->u).ubuf.maybeSize;
        }
        QOpenGLExtraFunctions::glBindBufferRange
                  ((QOpenGLExtraFunctions *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                   in_stack_fffffffffffffc88,(GLuint)((ulong)in_stack_fffffffffffffc80 >> 0x20),
                   (GLintptr)in_stack_fffffffffffffc78,(GLsizeiptr)in_stack_fffffffffffffc70);
      }
    }
    local_d4 = local_d4 + 1;
  } while( true );
}

Assistant:

void QRhiGles2::bindShaderResources(QGles2CommandBuffer *cbD,
                                    QRhiGraphicsPipeline *maybeGraphicsPs, QRhiComputePipeline *maybeComputePs,
                                    QRhiShaderResourceBindings *srb,
                                    const uint *dynOfsPairs, int dynOfsCount)
{
    QGles2ShaderResourceBindings *srbD = QRHI_RES(QGles2ShaderResourceBindings, srb);
    int texUnit = 1; // start from unit 1, keep 0 for resource mgmt stuff to avoid clashes
    bool activeTexUnitAltered = false;
    QGles2UniformDescriptionVector &uniforms(maybeGraphicsPs ? QRHI_RES(QGles2GraphicsPipeline, maybeGraphicsPs)->uniforms
                                                             : QRHI_RES(QGles2ComputePipeline, maybeComputePs)->uniforms);
    QGles2UniformState *uniformState = maybeGraphicsPs ? QRHI_RES(QGles2GraphicsPipeline, maybeGraphicsPs)->uniformState
                                                       : QRHI_RES(QGles2ComputePipeline, maybeComputePs)->uniformState;
    m_scratch.separateTextureBindings.clear();
    m_scratch.separateSamplerBindings.clear();

    for (int i = 0, ie = srbD->m_bindings.size(); i != ie; ++i) {
        const QRhiShaderResourceBinding::Data *b = shaderResourceBindingData(srbD->m_bindings.at(i));

        switch (b->type) {
        case QRhiShaderResourceBinding::UniformBuffer:
        {
            int viewOffset = b->u.ubuf.offset;
            for (int j = 0; j < dynOfsCount; ++j) {
                if (dynOfsPairs[2 * j] == uint(b->binding)) {
                    viewOffset = int(dynOfsPairs[2 * j + 1]);
                    break;
                }
            }
            QGles2Buffer *bufD = QRHI_RES(QGles2Buffer, b->u.ubuf.buf);
            const char *bufView = bufD->data.constData() + viewOffset;
            for (const QGles2UniformDescription &uniform : std::as_const(uniforms)) {
                if (uniform.binding == b->binding) {
                    // in a uniform buffer everything is at least 4 byte aligned
                    // so this should not cause unaligned reads
                    const void *src = bufView + uniform.offset;

#ifndef QT_NO_DEBUG
                    if (uniform.arrayDim > 0
                            && uniform.type != QShaderDescription::Float
                            && uniform.type != QShaderDescription::Vec2
                            && uniform.type != QShaderDescription::Vec3
                            && uniform.type != QShaderDescription::Vec4
                            && uniform.type != QShaderDescription::Int
                            && uniform.type != QShaderDescription::Int2
                            && uniform.type != QShaderDescription::Int3
                            && uniform.type != QShaderDescription::Int4
                            && uniform.type != QShaderDescription::Mat3
                            && uniform.type != QShaderDescription::Mat4)
                    {
                        qWarning("Uniform with buffer binding %d, buffer offset %d, type %d is an array, "
                                 "but arrays are only supported for float, vec2, vec3, vec4, int, "
                                 "ivec2, ivec3, ivec4, mat3 and mat4. "
                                 "Only the first element will be set.",
                                 uniform.binding, uniform.offset, uniform.type);
                    }
#endif

                    // Our input is an std140 layout uniform block. See
                    // "Standard Uniform Block Layout" in section 7.6.2.2 of
                    // the OpenGL spec. This has some peculiar alignment
                    // requirements, which is not what glUniform* wants. Hence
                    // the unpacking/repacking for arrays and certain types.

                    switch (uniform.type) {
                    case QShaderDescription::Float:
                    {
                        const int elemCount = uniform.arrayDim;
                        if (elemCount < 1) {
                            const float v = *reinterpret_cast<const float *>(src);
                            if (uniform.glslLocation <= QGles2UniformState::MAX_TRACKED_LOCATION) {
                                QGles2UniformState &thisUniformState(uniformState[uniform.glslLocation]);
                                if (thisUniformState.componentCount != 1 || thisUniformState.v[0] != v) {
                                    thisUniformState.componentCount = 1;
                                    thisUniformState.v[0] = v;
                                    f->glUniform1f(uniform.glslLocation, v);
                                }
                            } else {
                                f->glUniform1f(uniform.glslLocation, v);
                            }
                        } else {
                            // input is 16 bytes per element as per std140, have to convert to packed
                            m_scratch.packedArray.resize(elemCount);
                            qrhi_std140_to_packed(&m_scratch.packedArray.data()->f, 1, elemCount, src);
                            f->glUniform1fv(uniform.glslLocation, elemCount, &m_scratch.packedArray.constData()->f);
                        }
                    }
                        break;
                    case QShaderDescription::Vec2:
                    {
                        const int elemCount = uniform.arrayDim;
                        if (elemCount < 1) {
                            const float *v = reinterpret_cast<const float *>(src);
                            if (uniform.glslLocation <= QGles2UniformState::MAX_TRACKED_LOCATION) {
                                QGles2UniformState &thisUniformState(uniformState[uniform.glslLocation]);
                                if (thisUniformState.componentCount != 2
                                        || thisUniformState.v[0] != v[0]
                                        || thisUniformState.v[1] != v[1])
                                {
                                    thisUniformState.componentCount = 2;
                                    thisUniformState.v[0] = v[0];
                                    thisUniformState.v[1] = v[1];
                                    f->glUniform2fv(uniform.glslLocation, 1, v);
                                }
                            } else {
                                f->glUniform2fv(uniform.glslLocation, 1, v);
                            }
                        } else {
                            m_scratch.packedArray.resize(elemCount * 2);
                            qrhi_std140_to_packed(&m_scratch.packedArray.data()->f, 2, elemCount, src);
                            f->glUniform2fv(uniform.glslLocation, elemCount, &m_scratch.packedArray.constData()->f);
                        }
                    }
                        break;
                    case QShaderDescription::Vec3:
                    {
                        const int elemCount = uniform.arrayDim;
                        if (elemCount < 1) {
                            const float *v = reinterpret_cast<const float *>(src);
                            if (uniform.glslLocation <= QGles2UniformState::MAX_TRACKED_LOCATION) {
                                QGles2UniformState &thisUniformState(uniformState[uniform.glslLocation]);
                                if (thisUniformState.componentCount != 3
                                        || thisUniformState.v[0] != v[0]
                                        || thisUniformState.v[1] != v[1]
                                        || thisUniformState.v[2] != v[2])
                                {
                                    thisUniformState.componentCount = 3;
                                    thisUniformState.v[0] = v[0];
                                    thisUniformState.v[1] = v[1];
                                    thisUniformState.v[2] = v[2];
                                    f->glUniform3fv(uniform.glslLocation, 1, v);
                                }
                            } else {
                                f->glUniform3fv(uniform.glslLocation, 1, v);
                            }
                        } else {
                            m_scratch.packedArray.resize(elemCount * 3);
                            qrhi_std140_to_packed(&m_scratch.packedArray.data()->f, 3, elemCount, src);
                            f->glUniform3fv(uniform.glslLocation, elemCount, &m_scratch.packedArray.constData()->f);
                        }
                    }
                        break;
                    case QShaderDescription::Vec4:
                    {
                        const int elemCount = uniform.arrayDim;
                        if (elemCount < 1) {
                            const float *v = reinterpret_cast<const float *>(src);
                            if (uniform.glslLocation <= QGles2UniformState::MAX_TRACKED_LOCATION) {
                                QGles2UniformState &thisUniformState(uniformState[uniform.glslLocation]);
                                if (thisUniformState.componentCount != 4
                                        || thisUniformState.v[0] != v[0]
                                        || thisUniformState.v[1] != v[1]
                                        || thisUniformState.v[2] != v[2]
                                        || thisUniformState.v[3] != v[3])
                                {
                                    thisUniformState.componentCount = 4;
                                    thisUniformState.v[0] = v[0];
                                    thisUniformState.v[1] = v[1];
                                    thisUniformState.v[2] = v[2];
                                    thisUniformState.v[3] = v[3];
                                    f->glUniform4fv(uniform.glslLocation, 1, v);
                                }
                            } else {
                                f->glUniform4fv(uniform.glslLocation, 1, v);
                            }
                        } else {
                            f->glUniform4fv(uniform.glslLocation, elemCount, reinterpret_cast<const float *>(src));
                        }
                    }
                        break;
                    case QShaderDescription::Mat2:
                        f->glUniformMatrix2fv(uniform.glslLocation, 1, GL_FALSE, reinterpret_cast<const float *>(src));
                        break;
                    case QShaderDescription::Mat3:
                    {
                        const int elemCount = uniform.arrayDim;
                        if (elemCount < 1) {
                            // 4 floats per column (or row, if row-major)
                            float mat[9];
                            const float *srcMat = reinterpret_cast<const float *>(src);
                            memcpy(mat, srcMat, 3 * sizeof(float));
                            memcpy(mat + 3, srcMat + 4, 3 * sizeof(float));
                            memcpy(mat + 6, srcMat + 8, 3 * sizeof(float));
                            f->glUniformMatrix3fv(uniform.glslLocation, 1, GL_FALSE, mat);
                        } else {
                            m_scratch.packedArray.resize(elemCount * 9);
                            qrhi_std140_to_packed(&m_scratch.packedArray.data()->f, 3, elemCount * 3, src);
                            f->glUniformMatrix3fv(uniform.glslLocation, elemCount, GL_FALSE, &m_scratch.packedArray.constData()->f);
                        }
                    }
                        break;
                    case QShaderDescription::Mat4:
                        f->glUniformMatrix4fv(uniform.glslLocation, qMax(1, uniform.arrayDim), GL_FALSE, reinterpret_cast<const float *>(src));
                        break;
                    case QShaderDescription::Int:
                    {
                        const int elemCount = uniform.arrayDim;
                        if (elemCount < 1) {
                            f->glUniform1i(uniform.glslLocation, *reinterpret_cast<const qint32 *>(src));
                        } else {
                            m_scratch.packedArray.resize(elemCount);
                            qrhi_std140_to_packed(&m_scratch.packedArray.data()->i, 1, elemCount, src);
                            f->glUniform1iv(uniform.glslLocation, elemCount, &m_scratch.packedArray.constData()->i);
                        }
                    }
                        break;
                    case QShaderDescription::Int2:
                    {
                        const int elemCount = uniform.arrayDim;
                        if (elemCount < 1) {
                            f->glUniform2iv(uniform.glslLocation, 1, reinterpret_cast<const qint32 *>(src));
                        } else {
                            m_scratch.packedArray.resize(elemCount * 2);
                            qrhi_std140_to_packed(&m_scratch.packedArray.data()->i, 2, elemCount, src);
                            f->glUniform2iv(uniform.glslLocation, elemCount, &m_scratch.packedArray.constData()->i);
                        }
                    }
                        break;
                    case QShaderDescription::Int3:
                    {
                        const int elemCount = uniform.arrayDim;
                        if (elemCount < 1) {
                            f->glUniform3iv(uniform.glslLocation, 1, reinterpret_cast<const qint32 *>(src));
                        } else {
                            m_scratch.packedArray.resize(elemCount * 3);
                            qrhi_std140_to_packed(&m_scratch.packedArray.data()->i, 3, elemCount, src);
                            f->glUniform3iv(uniform.glslLocation, elemCount, &m_scratch.packedArray.constData()->i);
                        }
                    }
                        break;
                    case QShaderDescription::Int4:
                        f->glUniform4iv(uniform.glslLocation, qMax(1, uniform.arrayDim), reinterpret_cast<const qint32 *>(src));
                        break;
                    case QShaderDescription::Uint:
                        f->glUniform1ui(uniform.glslLocation, *reinterpret_cast<const quint32 *>(src));
                        break;
                    case QShaderDescription::Uint2:
                        f->glUniform2uiv(uniform.glslLocation, 1, reinterpret_cast<const quint32 *>(src));
                        break;
                    case QShaderDescription::Uint3:
                        f->glUniform3uiv(uniform.glslLocation, 1, reinterpret_cast<const quint32 *>(src));
                        break;
                    case QShaderDescription::Uint4:
                        f->glUniform4uiv(uniform.glslLocation, 1, reinterpret_cast<const quint32 *>(src));
                        break;
                    case QShaderDescription::Bool: // a glsl bool is 4 bytes, like (u)int
                        f->glUniform1i(uniform.glslLocation, *reinterpret_cast<const qint32 *>(src));
                        break;
                    case QShaderDescription::Bool2:
                        f->glUniform2iv(uniform.glslLocation, 1, reinterpret_cast<const qint32 *>(src));
                        break;
                    case QShaderDescription::Bool3:
                        f->glUniform3iv(uniform.glslLocation, 1, reinterpret_cast<const qint32 *>(src));
                        break;
                    case QShaderDescription::Bool4:
                        f->glUniform4iv(uniform.glslLocation, 1, reinterpret_cast<const qint32 *>(src));
                        break;
                    default:
                        qWarning("Uniform with buffer binding %d, buffer offset %d has unsupported type %d",
                                 uniform.binding, uniform.offset, uniform.type);
                        break;
                    }
                }
            }
        }
            break;
        case QRhiShaderResourceBinding::SampledTexture:
        {
            const QGles2SamplerDescriptionVector &samplers(maybeGraphicsPs ? QRHI_RES(QGles2GraphicsPipeline, maybeGraphicsPs)->samplers
                                                                           : QRHI_RES(QGles2ComputePipeline, maybeComputePs)->samplers);
            void *ps;
            uint psGeneration;
            if (maybeGraphicsPs) {
                ps = maybeGraphicsPs;
                psGeneration = QRHI_RES(QGles2GraphicsPipeline, maybeGraphicsPs)->generation;
            } else {
                ps = maybeComputePs;
                psGeneration = QRHI_RES(QGles2ComputePipeline, maybeComputePs)->generation;
            }
            for (int elem = 0; elem < b->u.stex.count; ++elem) {
                QGles2Texture *texD = QRHI_RES(QGles2Texture, b->u.stex.texSamplers[elem].tex);
                QGles2Sampler *samplerD = QRHI_RES(QGles2Sampler, b->u.stex.texSamplers[elem].sampler);
                for (const QGles2SamplerDescription &shaderSampler : samplers) {
                    if (shaderSampler.combinedBinding == b->binding) {
                        const int loc = shaderSampler.glslLocation + elem;
                        bindCombinedSampler(cbD, texD, samplerD, ps, psGeneration, loc, &texUnit, &activeTexUnitAltered);
                        break;
                    }
                }
            }
        }
            break;
        case QRhiShaderResourceBinding::Texture:
            for (int elem = 0; elem < b->u.stex.count; ++elem) {
                QGles2Texture *texD = QRHI_RES(QGles2Texture, b->u.stex.texSamplers[elem].tex);
                m_scratch.separateTextureBindings.append({ texD, b->binding, elem });
            }
            break;
        case QRhiShaderResourceBinding::Sampler:
        {
            QGles2Sampler *samplerD = QRHI_RES(QGles2Sampler, b->u.stex.texSamplers[0].sampler);
            m_scratch.separateSamplerBindings.append({ samplerD, b->binding });
        }
            break;
        case QRhiShaderResourceBinding::ImageLoad:
        case QRhiShaderResourceBinding::ImageStore:
        case QRhiShaderResourceBinding::ImageLoadStore:
        {
            QGles2Texture *texD = QRHI_RES(QGles2Texture, b->u.simage.tex);
            Q_ASSERT(texD->m_flags.testFlag(QRhiTexture::UsedWithLoadStore));
            // arrays, cubemaps, and 3D textures expose the whole texture with all layers/slices
            const bool layered = texD->m_flags.testFlag(QRhiTexture::CubeMap)
                                 || texD->m_flags.testFlag(QRhiTexture::ThreeDimensional)
                                 || texD->m_flags.testFlag(QRhiTexture::TextureArray);
            GLenum access = GL_READ_WRITE;
            if (b->type == QRhiShaderResourceBinding::ImageLoad)
                access = GL_READ_ONLY;
            else if (b->type == QRhiShaderResourceBinding::ImageStore)
                access = GL_WRITE_ONLY;
            f->glBindImageTexture(GLuint(b->binding), texD->texture,
                                  b->u.simage.level, layered, 0,
                                  access, texD->glsizedintformat);
        }
            break;
        case QRhiShaderResourceBinding::BufferLoad:
        case QRhiShaderResourceBinding::BufferStore:
        case QRhiShaderResourceBinding::BufferLoadStore:
        {
            QGles2Buffer *bufD = QRHI_RES(QGles2Buffer, b->u.sbuf.buf);
            Q_ASSERT(bufD->m_usage.testFlag(QRhiBuffer::StorageBuffer));
            if (b->u.sbuf.offset == 0 && b->u.sbuf.maybeSize == 0)
                f->glBindBufferBase(GL_SHADER_STORAGE_BUFFER, GLuint(b->binding), bufD->buffer);
            else
                f->glBindBufferRange(GL_SHADER_STORAGE_BUFFER, GLuint(b->binding), bufD->buffer,
                                     b->u.sbuf.offset, b->u.sbuf.maybeSize ? b->u.sbuf.maybeSize : bufD->m_size);
        }
            break;
        default:
            Q_UNREACHABLE();
            break;
        }
    }

    if (!m_scratch.separateTextureBindings.isEmpty() || !m_scratch.separateSamplerBindings.isEmpty()) {
        const QGles2SamplerDescriptionVector &samplers(maybeGraphicsPs ? QRHI_RES(QGles2GraphicsPipeline, maybeGraphicsPs)->samplers
                                                                       : QRHI_RES(QGles2ComputePipeline, maybeComputePs)->samplers);
        void *ps;
        uint psGeneration;
        if (maybeGraphicsPs) {
            ps = maybeGraphicsPs;
            psGeneration = QRHI_RES(QGles2GraphicsPipeline, maybeGraphicsPs)->generation;
        } else {
            ps = maybeComputePs;
            psGeneration = QRHI_RES(QGles2ComputePipeline, maybeComputePs)->generation;
        }
        for (const QGles2SamplerDescription &shaderSampler : samplers) {
            if (shaderSampler.combinedBinding >= 0)
                continue;
            for (const Scratch::SeparateSampler &sepSampler : std::as_const(m_scratch.separateSamplerBindings)) {
                if (sepSampler.binding != shaderSampler.sbinding)
                    continue;
                for (const Scratch::SeparateTexture &sepTex : std::as_const(m_scratch.separateTextureBindings)) {
                    if (sepTex.binding != shaderSampler.tbinding)
                        continue;
                    const int loc = shaderSampler.glslLocation + sepTex.elem;
                    bindCombinedSampler(cbD, sepTex.texture, sepSampler.sampler, ps, psGeneration,
                                        loc, &texUnit, &activeTexUnitAltered);
                }
            }
        }
    }

    if (activeTexUnitAltered)
        f->glActiveTexture(GL_TEXTURE0);
}